

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O3

void helics::generateInterfaceConfig(json *iblock,HandleManager *hm,GlobalFederateId *fed)

{
  InterfaceType IVar1;
  value_t vVar2;
  int iVar3;
  json_value jVar4;
  bool includeID;
  bool bVar5;
  reference pvVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  _Elt_pointer handle;
  _Elt_pointer pBVar7;
  _Map_pointer ppBVar8;
  data local_b0;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  data local_80;
  data local_70;
  data local_60;
  data local_50;
  _Elt_pointer local_40;
  GlobalFederateId *local_38;
  
  iVar3 = fed->gid;
  handle = (hm->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_40 = (hm->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (handle != local_40) {
    includeID = iVar3 == -2010000000 || iVar3 == -1700000000;
    pBVar7 = (hm->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppBVar8 = (hm->handles).
              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    local_88 = 0;
    bVar5 = false;
    local_90 = 0;
    local_98 = 0;
    local_a0 = 0;
    local_38 = fed;
    do {
      if ((((handle->handle).fed_id.gid == local_38->gid) || (iVar3 == -1700000000)) ||
         (iVar3 == -2010000000)) {
        IVar1 = handle->handleType;
        if (IVar1 < INPUT) {
          if (IVar1 == ENDPOINT) {
            if (!bVar5) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_80,(initializer_list_t)ZEXT816(0),false,array);
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)iblock,"endpoints");
              vVar2 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = local_80.m_type;
              jVar4 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = local_80.m_value;
              local_80.m_type = vVar2;
              local_80.m_value = jVar4;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_80);
            }
            storeEndpoint(handle,iblock,includeID);
            bVar5 = true;
          }
          else if (IVar1 == FILTER) {
            if ((local_98 & 1) == 0) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_70,(initializer_list_t)ZEXT816(0),false,array);
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)iblock,"filters");
              vVar2 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = local_70.m_type;
              jVar4 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = local_70.m_value;
              local_70.m_type = vVar2;
              local_70.m_value = jVar4;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_70);
            }
            storeFilter(handle,iblock,includeID);
            local_98 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
          }
        }
        else if (IVar1 == INPUT) {
          if ((local_90 & 1) == 0) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_50,(initializer_list_t)ZEXT816(0),false,array);
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)iblock,"inputs");
            vVar2 = (pvVar6->m_data).m_type;
            (pvVar6->m_data).m_type = local_50.m_type;
            jVar4 = (pvVar6->m_data).m_value;
            (pvVar6->m_data).m_value = local_50.m_value;
            local_50.m_type = vVar2;
            local_50.m_value = jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_50);
          }
          storeInput(handle,iblock,includeID);
          local_90 = CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
        }
        else if (IVar1 == PUBLICATION) {
          if ((local_88 & 1) == 0) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_b0,(initializer_list_t)ZEXT816(0),false,array);
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)iblock,"publications");
            vVar2 = (pvVar6->m_data).m_type;
            (pvVar6->m_data).m_type = local_b0.m_type;
            jVar4 = (pvVar6->m_data).m_value;
            (pvVar6->m_data).m_value = local_b0.m_value;
            local_b0.m_type = vVar2;
            local_b0.m_value = jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_b0);
          }
          storePublication(handle,iblock,includeID);
          local_88 = CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
        }
        else if (IVar1 == TRANSLATOR) {
          if ((local_a0 & 1) == 0) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_60,(initializer_list_t)ZEXT816(0),false,array);
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)iblock,"translators");
            vVar2 = (pvVar6->m_data).m_type;
            (pvVar6->m_data).m_type = local_60.m_type;
            jVar4 = (pvVar6->m_data).m_value;
            (pvVar6->m_data).m_value = local_60.m_value;
            local_60.m_type = vVar2;
            local_60.m_value = jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_60);
          }
          storeTranslator(handle,iblock,includeID);
          local_a0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
      }
      handle = handle + 1;
      if (handle == pBVar7) {
        handle = ppBVar8[1];
        ppBVar8 = ppBVar8 + 1;
        pBVar7 = handle + 3;
      }
    } while (handle != local_40);
  }
  return;
}

Assistant:

void generateInterfaceConfig(nlohmann::json& iblock,
                             const helics::HandleManager& hm,
                             const helics::GlobalFederateId& fed)

{
    bool hasPubs{false};
    bool hasEpts{false};
    bool hasInputs{false};
    bool hasFilt{false};
    bool hasTranslators{false};
    bool allInfo = !fed.isValid();
    for (const auto& handle : hm) {
        if (handle.handle.fed_id == fed || allInfo) {
            switch (handle.handleType) {
                case InterfaceType::ENDPOINT:
                    if (!hasEpts) {
                        iblock["endpoints"] = nlohmann::json::array();
                        hasEpts = true;
                    }
                    storeEndpoint(handle, iblock, allInfo);
                    break;
                case InterfaceType::INPUT:
                    if (!hasInputs) {
                        iblock["inputs"] = nlohmann::json::array();
                        hasInputs = true;
                    }
                    storeInput(handle, iblock, allInfo);
                    break;
                case InterfaceType::TRANSLATOR:
                    if (!hasTranslators) {
                        iblock["translators"] = nlohmann::json::array();
                        hasTranslators = true;
                    }
                    storeTranslator(handle, iblock, allInfo);
                    break;
                case InterfaceType::PUBLICATION:
                    if (!hasPubs) {
                        iblock["publications"] = nlohmann::json::array();
                        hasPubs = true;
                    }
                    storePublication(handle, iblock, allInfo);
                    break;
                case InterfaceType::FILTER:
                    if (!hasFilt) {
                        iblock["filters"] = nlohmann::json::array();
                        hasFilt = true;
                    }
                    storeFilter(handle, iblock, allInfo);
                    break;
                default:
                    break;
            }
        }
    }
}